

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNearIsMatch(int *pRc,Fts5ExprNearset *pNear)

{
  Fts5ExprPhrase *pFVar1;
  bool bVar2;
  int iVar3;
  Fts5LookaheadReader *p;
  long lVar4;
  int bRet;
  Fts5PoslistWriter *pWriter;
  i64 iPos;
  Fts5LookaheadReader *pPos;
  i64 iMax;
  i64 iMin;
  int iAdv;
  Fts5Buffer *pPoslist;
  sqlite3_int64 nByte;
  int local_100;
  int bMatch;
  int rc;
  int i;
  Fts5ExprPhrase **apPhrase;
  Fts5NearTrimmer *a;
  Fts5NearTrimmer aStatic [4];
  Fts5ExprNearset *pNear_local;
  int *pRc_local;
  
  apPhrase = (Fts5ExprPhrase **)&a;
  _rc = pNear->apPhrase;
  local_100 = *pRc;
  if (pNear->nPhrase < 5) {
    memset(&a,0,0xc0);
  }
  else {
    apPhrase = (Fts5ExprPhrase **)sqlite3Fts5MallocZero(&local_100,(long)pNear->nPhrase * 0x30);
  }
  if (local_100 == 0) {
    for (bMatch = 0; bMatch < pNear->nPhrase; bMatch = bMatch + 1) {
      pFVar1 = _rc[bMatch];
      fts5LookaheadReaderInit
                ((pFVar1->poslist).p,(pFVar1->poslist).n,
                 (Fts5LookaheadReader *)(apPhrase + (long)bMatch * 6));
      (pFVar1->poslist).n = 0;
      apPhrase[(long)bMatch * 6 + 5] = (Fts5ExprPhrase *)&pFVar1->poslist;
    }
    do {
      pPos = (Fts5LookaheadReader *)apPhrase[2];
      do {
        bVar2 = true;
        for (bMatch = 0; bMatch < pNear->nPhrase; bMatch = bMatch + 1) {
          p = (Fts5LookaheadReader *)(apPhrase + (long)bMatch * 6);
          lVar4 = (long)pPos + (-(long)pNear->nNear - (long)pNear->apPhrase[bMatch]->nTerm);
          if ((p->iPos < lVar4) || ((long)pPos < p->iPos)) {
            bVar2 = false;
            while (p->iPos < lVar4) {
              iVar3 = fts5LookaheadReaderNext(p);
              if (iVar3 != 0) goto LAB_0027a871;
            }
            if ((long)pPos < p->iPos) {
              pPos = (Fts5LookaheadReader *)p->iPos;
            }
          }
        }
      } while (!bVar2);
      for (bMatch = 0; bMatch < pNear->nPhrase; bMatch = bMatch + 1) {
        if ((*(int *)&(apPhrase[(long)bMatch * 6 + 5]->poslist).p == 0) ||
           (apPhrase[(long)bMatch * 6 + 2] !=
            (Fts5ExprPhrase *)((Fts5PoslistWriter *)(apPhrase + (long)bMatch * 6 + 4))->iPrev)) {
          sqlite3Fts5PoslistWriterAppend
                    ((Fts5Buffer *)apPhrase[(long)bMatch * 6 + 5],
                     (Fts5PoslistWriter *)(apPhrase + (long)bMatch * 6 + 4),
                     (i64)apPhrase[(long)bMatch * 6 + 2]);
        }
      }
      iMin._4_4_ = 0;
      iMax = (i64)apPhrase[3];
      for (bMatch = 0; bMatch < pNear->nPhrase; bMatch = bMatch + 1) {
        if ((long)apPhrase[(long)bMatch * 6 + 3] < iMax) {
          iMax = (i64)apPhrase[(long)bMatch * 6 + 3];
          iMin._4_4_ = bMatch;
        }
      }
      iVar3 = fts5LookaheadReaderNext((Fts5LookaheadReader *)(apPhrase + (long)iMin._4_4_ * 6));
    } while (iVar3 == 0);
LAB_0027a871:
    pRc_local._4_4_ = (uint)(0 < *(int *)&(apPhrase[5]->poslist).p);
    *pRc = local_100;
    if (apPhrase != (Fts5ExprPhrase **)&a) {
      sqlite3_free(apPhrase);
    }
  }
  else {
    *pRc = local_100;
    pRc_local._4_4_ = 0;
  }
  return pRc_local._4_4_;
}

Assistant:

static int fts5ExprNearIsMatch(int *pRc, Fts5ExprNearset *pNear){
  Fts5NearTrimmer aStatic[4];
  Fts5NearTrimmer *a = aStatic;
  Fts5ExprPhrase **apPhrase = pNear->apPhrase;

  int i;
  int rc = *pRc;
  int bMatch;

  assert( pNear->nPhrase>1 );

  /* If the aStatic[] array is not large enough, allocate a large array
  ** using sqlite3_malloc(). This approach could be improved upon. */
  if( pNear->nPhrase>ArraySize(aStatic) ){
    sqlite3_int64 nByte = sizeof(Fts5NearTrimmer) * pNear->nPhrase;
    a = (Fts5NearTrimmer*)sqlite3Fts5MallocZero(&rc, nByte);
  }else{
    memset(aStatic, 0, sizeof(aStatic));
  }
  if( rc!=SQLITE_OK ){
    *pRc = rc;
    return 0;
  }

  /* Initialize a lookahead iterator for each phrase. After passing the
  ** buffer and buffer size to the lookaside-reader init function, zero
  ** the phrase poslist buffer. The new poslist for the phrase (containing
  ** the same entries as the original with some entries removed on account 
  ** of the NEAR constraint) is written over the original even as it is
  ** being read. This is safe as the entries for the new poslist are a
  ** subset of the old, so it is not possible for data yet to be read to
  ** be overwritten.  */
  for(i=0; i<pNear->nPhrase; i++){
    Fts5Buffer *pPoslist = &apPhrase[i]->poslist;
    fts5LookaheadReaderInit(pPoslist->p, pPoslist->n, &a[i].reader);
    pPoslist->n = 0;
    a[i].pOut = pPoslist;
  }

  while( 1 ){
    int iAdv;
    i64 iMin;
    i64 iMax;

    /* This block advances the phrase iterators until they point to a set of
    ** entries that together comprise a match.  */
    iMax = a[0].reader.iPos;
    do {
      bMatch = 1;
      for(i=0; i<pNear->nPhrase; i++){
        Fts5LookaheadReader *pPos = &a[i].reader;
        iMin = iMax - pNear->apPhrase[i]->nTerm - pNear->nNear;
        if( pPos->iPos<iMin || pPos->iPos>iMax ){
          bMatch = 0;
          while( pPos->iPos<iMin ){
            if( fts5LookaheadReaderNext(pPos) ) goto ismatch_out;
          }
          if( pPos->iPos>iMax ) iMax = pPos->iPos;
        }
      }
    }while( bMatch==0 );

    /* Add an entry to each output position list */
    for(i=0; i<pNear->nPhrase; i++){
      i64 iPos = a[i].reader.iPos;
      Fts5PoslistWriter *pWriter = &a[i].writer;
      if( a[i].pOut->n==0 || iPos!=pWriter->iPrev ){
        sqlite3Fts5PoslistWriterAppend(a[i].pOut, pWriter, iPos);
      }
    }

    iAdv = 0;
    iMin = a[0].reader.iLookahead;
    for(i=0; i<pNear->nPhrase; i++){
      if( a[i].reader.iLookahead < iMin ){
        iMin = a[i].reader.iLookahead;
        iAdv = i;
      }
    }
    if( fts5LookaheadReaderNext(&a[iAdv].reader) ) goto ismatch_out;
  }

  ismatch_out: {
    int bRet = a[0].pOut->n>0;
    *pRc = rc;
    if( a!=aStatic ) sqlite3_free(a);
    return bRet;
  }
}